

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6.cpp
# Opt level: O3

void __thiscall Nes_Vrc6::load_snapshot(Nes_Vrc6 *this,vrc6_snapshot_t *in)

{
  uint8_t *puVar1;
  int i;
  long lVar2;
  vrc6_snapshot_t *pvVar3;
  Nes_Vrc6 *pNVar4;
  int r;
  long lVar5;
  
  this->last_time = 0;
  lVar2 = 0x10;
  do {
    this->oscs[0].regs[lVar2 + -0xe] = '\0';
    puVar1 = this->oscs[0].regs + lVar2 + -0x10;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1 = this->oscs[0].regs + lVar2;
    *(undefined8 *)puVar1 = 0;
    *(Blip_Buffer **)(puVar1 + 8) = (Blip_Buffer *)0x1;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x70);
  this->oscs[2].amp = (uint)in->saw_amp;
  lVar2 = 0;
  pvVar3 = in;
  pNVar4 = this;
  do {
    lVar5 = 0;
    do {
      pNVar4->oscs[0].regs[lVar5] = pvVar3->regs[0][lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    this->oscs[lVar2].delay = (uint)in->delays[lVar2];
    this->oscs[lVar2].phase = (uint)in->phases[lVar2];
    lVar2 = lVar2 + 1;
    pNVar4 = (Nes_Vrc6 *)(pNVar4->oscs + 1);
    pvVar3 = (vrc6_snapshot_t *)(pvVar3->regs + 1);
  } while (lVar2 != 3);
  if (this->oscs[2].phase != 0) {
    return;
  }
  this->oscs[2].phase = 1;
  return;
}

Assistant:

void Nes_Vrc6::reset()
{
	last_time = 0;
	for ( int i = 0; i < osc_count; i++ )
	{
		Vrc6_Osc& osc = oscs [i];
		for ( int j = 0; j < reg_count; j++ )
			osc.regs [j] = 0;
		osc.delay = 0;
		osc.last_amp = 0;
		osc.phase = 1;
		osc.amp = 0;
	}
}